

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtract.hpp
# Opt level: O1

int duckdb::SubtractOperatorOverflowCheck::Operation<int,int,int>(int left,int right)

{
  bool bVar1;
  OutOfRangeException *this;
  int result;
  int local_a4;
  string local_a0;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar1 = duckdb::TrySubtractOperator::Operation<int,int,int>(left,right,&local_a4);
  if (bVar1) {
    return local_a4;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,"Overflow in subtraction of %s (%s - %s)!","");
  duckdb::TypeIdToString_abi_cxx11_((PhysicalType)&local_40);
  NumericHelper::ToString<int>(&local_60,left);
  NumericHelper::ToString<int>(&local_80,right);
  OutOfRangeException::
  OutOfRangeException<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
            (this,&local_a0,&local_40,&local_60,&local_80);
  __cxa_throw(this,&OutOfRangeException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA left, TB right) {
		TR result;
		if (!TrySubtractOperator::Operation(left, right, result)) {
			throw OutOfRangeException("Overflow in subtraction of %s (%s - %s)!", TypeIdToString(GetTypeId<TA>()),
			                          NumericHelper::ToString(left), NumericHelper::ToString(right));
		}
		return result;
	}